

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantDupConeSupp_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vCis,Vec_Int_t *vObjs,
               _func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int iObj_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObjNew;
  int iLit_1;
  int iLit;
  int iObj;
  int iLit1;
  int iLit0;
  _func_int_void_ptr_int *pFuncCiToKeep_local;
  Vec_Int_t *vObjs_local;
  Vec_Int_t *vCis_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iObj_00 = Gia_ObjId(p,pObj);
  iVar1 = Gia_ObjCopyArray(p,iObj_00);
  if (iVar1 < 0) {
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                      ,0xdb,
                      "void Gia_ManQuantDupConeSupp_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, int (*)(void *, int), void *)"
                     );
      }
      pGVar4 = Gia_ObjFanin0(pObj);
      Gia_ManQuantDupConeSupp_rec(pNew,p,pGVar4,vCis,vObjs,pFuncCiToKeep,pData);
      pGVar4 = Gia_ObjFanin1(pObj);
      Gia_ManQuantDupConeSupp_rec(pNew,p,pGVar4,vCis,vObjs,pFuncCiToKeep,pData);
      iVar1 = Gia_ObjFaninId0(pObj,iObj_00);
      iVar1 = Gia_ObjCopyArray(p,iVar1);
      iVar2 = Gia_ObjFaninId1(pObj,iObj_00);
      iVar2 = Gia_ObjCopyArray(p,iVar2);
      iVar3 = Gia_ObjFaninC0(pObj);
      iVar1 = Abc_LitNotCond(iVar1,iVar3);
      iVar3 = Gia_ObjFaninC1(pObj);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
      Gia_ObjSetCopyArray(p,iObj_00,iVar1);
      Vec_IntPush(vObjs,iObj_00);
    }
    else {
      iVar1 = Gia_ManAppendCi(pNew);
      iVar2 = Abc_Lit2Var(iVar1);
      pGVar4 = Gia_ManObj(pNew,iVar2);
      Gia_ManQuantSetSuppZero(pNew);
      iVar2 = Gia_ObjCioId(pObj);
      iVar2 = (*pFuncCiToKeep)(pData,iVar2);
      if (iVar2 == 0) {
        Gia_ManQuantSetSuppCi(pNew,pGVar4);
      }
      Gia_ObjSetCopyArray(p,iObj_00,iVar1);
      Vec_IntPush(vCis,iObj_00);
    }
  }
  return;
}

Assistant:

void Gia_ManQuantDupConeSupp_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vCis, Vec_Int_t * vObjs, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int iLit0, iLit1, iObj = Gia_ObjId( p, pObj );
    int iLit = Gia_ObjCopyArray( p, iObj );
    if ( iLit >= 0 )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        int iLit = Gia_ManAppendCi( pNew );
        Gia_Obj_t * pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
        Gia_ManQuantSetSuppZero( pNew );
        if ( !pFuncCiToKeep( pData, Gia_ObjCioId(pObj) ) )
        {
            //printf( "Collecting CI %d\n", Gia_ObjCioId(pObj)+1 );
            Gia_ManQuantSetSuppCi( pNew, pObjNew );
        }
        Gia_ObjSetCopyArray( p, iObj, iLit );
        Vec_IntPush( vCis, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin0(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin1(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
    iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
    iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
    iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
    iLit  = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    Gia_ObjSetCopyArray( p, iObj, iLit );
    Vec_IntPush( vObjs, iObj );
}